

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDFace::SharpEdgeCount(ON_SubDFace *this,ON_SubDEdgeSharpness *sharpness_range)

{
  bool bVar1;
  ON_SubDEdgeSharpness OVar2;
  ON_SubDEdgeSharpness local_40;
  ON_SubDEdgeSharpness s;
  ON_SubDEdge *e;
  ON_SubDEdgePtr *pOStack_28;
  unsigned_short fei;
  ON_SubDEdgePtr *eptr;
  uint sharp_edge_count;
  ON_SubDEdgeSharpness *sharpness_range_local;
  ON_SubDFace *this_local;
  
  *(ON_SubDEdgeSharpness *)sharpness_range->m_edge_sharpness = (ON_SubDEdgeSharpness)0x0;
  eptr._4_4_ = 0;
  pOStack_28 = this->m_edge4;
  e._6_2_ = 0;
  while ((e._6_2_ < this->m_edge_count &&
         ((e._6_2_ != 4 || (pOStack_28 = this->m_edgex, pOStack_28 != (ON_SubDEdgePtr *)0x0))))) {
    s.m_edge_sharpness = (float  [2])(pOStack_28->m_ptr & 0xfffffffffffffff8);
    if ((s.m_edge_sharpness != (float  [2])0x0) &&
       (bVar1 = ON_SubDEdge::IsSharp((ON_SubDEdge *)s.m_edge_sharpness), bVar1)) {
      local_40 = ON_SubDEdge::Sharpness(s.m_edge_sharpness,false);
      OVar2 = ON_SubDEdgeSharpness::Union(sharpness_range,&local_40);
      *(ON_SubDEdgeSharpness *)sharpness_range->m_edge_sharpness = OVar2;
      eptr._4_4_ = eptr._4_4_ + 1;
    }
    e._6_2_ = e._6_2_ + 1;
    pOStack_28 = pOStack_28 + 1;
  }
  return eptr._4_4_;
}

Assistant:

unsigned int ON_SubDFace::SharpEdgeCount(ON_SubDEdgeSharpness& sharpness_range) const
{
  sharpness_range = ON_SubDEdgeSharpness::Smooth;
  unsigned int sharp_edge_count = 0;
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fei = 0; fei < m_edge_count; ++fei, ++eptr)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
    if (nullptr == e || false == e->IsSharp())
      continue;
    const ON_SubDEdgeSharpness s = e->Sharpness(false);
    sharpness_range = ON_SubDEdgeSharpness::Union(sharpness_range, s);
    ++sharp_edge_count;
  }
  return sharp_edge_count;
}